

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmaster.c
# Opt level: O0

void jpeg_calc_output_dimensions(j_decompress_ptr cinfo)

{
  boolean bVar1;
  long lVar2;
  j_decompress_ptr in_RDI;
  bool bVar3;
  int ssize;
  jpeg_component_info *compptr;
  int ci;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar4;
  int local_1c;
  jpeg_component_info *local_18;
  int local_c;
  
  if (in_RDI->global_state != 0xca) {
    in_RDI->err->msg_code = 0x14;
    (in_RDI->err->msg_parm).i[0] = in_RDI->global_state;
    (*in_RDI->err->error_exit)((j_common_ptr)in_RDI);
  }
  jpeg_core_output_dimensions
            ((j_decompress_ptr)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  local_c = 0;
  local_18 = in_RDI->comp_info;
  for (; local_c < in_RDI->num_components; local_c = local_c + 1) {
    local_1c = in_RDI->min_DCT_scaled_size;
    while( true ) {
      bVar3 = false;
      if ((local_1c < 8) &&
         (bVar3 = false,
         (in_RDI->max_h_samp_factor * in_RDI->min_DCT_scaled_size) %
         (local_18->h_samp_factor * local_1c * 2) == 0)) {
        bVar3 = (in_RDI->max_v_samp_factor * in_RDI->min_DCT_scaled_size) %
                (local_18->v_samp_factor * local_1c * 2) == 0;
      }
      if (!bVar3) break;
      local_1c = local_1c << 1;
    }
    local_18->DCT_scaled_size = local_1c;
    local_18 = local_18 + 1;
  }
  local_c = 0;
  local_18 = in_RDI->comp_info;
  for (; local_c < in_RDI->num_components; local_c = local_c + 1) {
    lVar2 = jdiv_round_up((ulong)in_RDI->image_width *
                          (long)(local_18->h_samp_factor * local_18->DCT_scaled_size),
                          (long)(in_RDI->max_h_samp_factor << 3));
    local_18->downsampled_width = (JDIMENSION)lVar2;
    lVar2 = jdiv_round_up((ulong)in_RDI->image_height *
                          (long)(local_18->v_samp_factor * local_18->DCT_scaled_size),
                          (long)(in_RDI->max_v_samp_factor << 3));
    local_18->downsampled_height = (JDIMENSION)lVar2;
    local_18 = local_18 + 1;
  }
  switch(in_RDI->out_color_space) {
  case JCS_GRAYSCALE:
    in_RDI->out_color_components = 1;
    break;
  case JCS_RGB:
  case JCS_EXT_RGB:
  case JCS_EXT_RGBX:
  case JCS_EXT_BGR:
  case JCS_EXT_BGRX:
  case JCS_EXT_XBGR:
  case JCS_EXT_XRGB:
  case JCS_EXT_RGBA:
  case JCS_EXT_BGRA:
  case JCS_EXT_ABGR:
  case JCS_EXT_ARGB:
    in_RDI->out_color_components = rgb_pixelsize[in_RDI->out_color_space];
    break;
  case JCS_YCbCr:
  case JCS_RGB565:
    in_RDI->out_color_components = 3;
    break;
  case JCS_CMYK:
  case JCS_YCCK:
    in_RDI->out_color_components = 4;
    break;
  default:
    in_RDI->out_color_components = in_RDI->num_components;
  }
  if (in_RDI->quantize_colors == 0) {
    iVar4 = in_RDI->out_color_components;
  }
  else {
    iVar4 = 1;
  }
  in_RDI->output_components = iVar4;
  bVar1 = use_merged_upsample(in_RDI);
  if (bVar1 == 0) {
    in_RDI->rec_outbuf_height = 1;
  }
  else {
    in_RDI->rec_outbuf_height = in_RDI->max_v_samp_factor;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_calc_output_dimensions(j_decompress_ptr cinfo)
/* Do computations that are needed before master selection phase */
{
#ifdef IDCT_SCALING_SUPPORTED
  int ci;
  jpeg_component_info *compptr;
#endif

  /* Prevent application from calling me at wrong times */
  if (cinfo->global_state != DSTATE_READY)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  /* Compute core output image dimensions and DCT scaling choices. */
  jpeg_core_output_dimensions(cinfo);

#ifdef IDCT_SCALING_SUPPORTED

  /* In selecting the actual DCT scaling for each component, we try to
   * scale up the chroma components via IDCT scaling rather than upsampling.
   * This saves time if the upsampler gets to use 1:1 scaling.
   * Note this code adapts subsampling ratios which are powers of 2.
   */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    int ssize = cinfo->_min_DCT_scaled_size;
    while (ssize < DCTSIZE &&
           ((cinfo->max_h_samp_factor * cinfo->_min_DCT_scaled_size) %
            (compptr->h_samp_factor * ssize * 2) == 0) &&
           ((cinfo->max_v_samp_factor * cinfo->_min_DCT_scaled_size) %
            (compptr->v_samp_factor * ssize * 2) == 0)) {
      ssize = ssize * 2;
    }
#if JPEG_LIB_VERSION >= 70
    compptr->DCT_h_scaled_size = compptr->DCT_v_scaled_size = ssize;
#else
    compptr->DCT_scaled_size = ssize;
#endif
  }

  /* Recompute downsampled dimensions of components;
   * application needs to know these if using raw downsampled data.
   */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Size in samples, after IDCT scaling */
    compptr->downsampled_width = (JDIMENSION)
      jdiv_round_up((long)cinfo->image_width *
                    (long)(compptr->h_samp_factor * compptr->_DCT_scaled_size),
                    (long)(cinfo->max_h_samp_factor * DCTSIZE));
    compptr->downsampled_height = (JDIMENSION)
      jdiv_round_up((long)cinfo->image_height *
                    (long)(compptr->v_samp_factor * compptr->_DCT_scaled_size),
                    (long)(cinfo->max_v_samp_factor * DCTSIZE));
  }

#else /* !IDCT_SCALING_SUPPORTED */

  /* Hardwire it to "no scaling" */
  cinfo->output_width = cinfo->image_width;
  cinfo->output_height = cinfo->image_height;
  /* jdinput.c has already initialized DCT_scaled_size to DCTSIZE,
   * and has computed unscaled downsampled_width and downsampled_height.
   */

#endif /* IDCT_SCALING_SUPPORTED */

  /* Report number of components in selected colorspace. */
  /* Probably this should be in the color conversion module... */
  switch (cinfo->out_color_space) {
  case JCS_GRAYSCALE:
    cinfo->out_color_components = 1;
    break;
  case JCS_RGB:
  case JCS_EXT_RGB:
  case JCS_EXT_RGBX:
  case JCS_EXT_BGR:
  case JCS_EXT_BGRX:
  case JCS_EXT_XBGR:
  case JCS_EXT_XRGB:
  case JCS_EXT_RGBA:
  case JCS_EXT_BGRA:
  case JCS_EXT_ABGR:
  case JCS_EXT_ARGB:
    cinfo->out_color_components = rgb_pixelsize[cinfo->out_color_space];
    break;
  case JCS_YCbCr:
  case JCS_RGB565:
    cinfo->out_color_components = 3;
    break;
  case JCS_CMYK:
  case JCS_YCCK:
    cinfo->out_color_components = 4;
    break;
  default:                      /* else must be same colorspace as in file */
    cinfo->out_color_components = cinfo->num_components;
    break;
  }
  cinfo->output_components = (cinfo->quantize_colors ? 1 :
                              cinfo->out_color_components);

  /* See if upsampler will want to emit more than one row at a time */
  if (use_merged_upsample(cinfo))
    cinfo->rec_outbuf_height = cinfo->max_v_samp_factor;
  else
    cinfo->rec_outbuf_height = 1;
}